

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_table_segment_info(table_segment sec)

{
  table_pointer ptVar1;
  uint local_24;
  int i;
  table_pointer table_segment_addr;
  table_segment sec_local;
  
  ptVar1 = sec.table_segment_addr;
  for (local_24 = 0; local_24 < sec.table_segment_count; local_24 = local_24 + 1) {
    printf("  - table[%d]: type=funcref ",(ulong)local_24);
    printf("min=%d",(ulong)ptVar1[(int)local_24].limit.min);
    if (ptVar1[(int)local_24].limit.tag == '\x01') {
      printf(" max=%d",(ulong)ptVar1[(int)local_24].limit.max);
    }
    puts("");
  }
  return;
}

Assistant:

void print_table_segment_info(table_segment sec) {
    table_pointer table_segment_addr;
    for (int i = 0; i < sec.table_segment_count; ++i) {
        table_segment_addr = sec.table_segment_addr + i;
        printf("  - table[%d]: type=funcref ", i);
        printf("min=%d", table_segment_addr->limit.min);
        if (table_segment_addr->limit.tag == min_and_max)
            printf(" max=%d", table_segment_addr->limit.max);
        puts("");
    }
}